

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O1

bool __thiscall libtorrent::bdecode_node::has_soft_error(bdecode_node *this,span<char> error)

{
  int *piVar1;
  bdecode_token *pbVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  char *pcVar9;
  bool bVar10;
  int iVar11;
  int k1;
  int iVar12;
  int iVar13;
  int iVar14;
  int token;
  vector<int,_std::allocator<int>_> stack;
  int local_6c;
  vector<int,_std::allocator<int>_> local_68;
  char *local_48;
  size_t local_40;
  bdecode_node *local_38;
  
  local_40 = error.m_len;
  local_48 = error.m_ptr;
  local_6c = this->m_token_idx;
  if (((long)local_6c == -1) ||
     (*(uint *)(this->m_root_tokens + local_6c) < 0x20000000 &&
      (*(uint *)(this->m_root_tokens + local_6c) & 0xe0000000) != 0xa0000000)) {
    bVar10 = false;
  }
  else {
    pbVar2 = this->m_root_tokens;
    local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (int *)0x0;
    local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (int *)0x0;
    local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    ::std::vector<int,_std::allocator<int>_>::reserve(&local_68,100);
    local_38 = this;
    do {
      uVar5 = SUB84(pbVar2[local_6c],0);
      switch((uint)((ulong)pbVar2[local_6c] >> 0x1d) & 7) {
      case 1:
      case 2:
        if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          ::std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_68,
                     (iterator)
                     local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_6c);
        }
        else {
          *local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = local_6c;
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        break;
      case 3:
      case 5:
        uVar7 = (ulong)(uVar5 & 0x1fffffff);
        if ((this->m_buffer[uVar7] == '0') && (this->m_buffer[uVar7 + 1] != ':')) {
          pcVar9 = "leading zero in string length";
LAB_0018682c:
          snprintf(local_48,local_40,pcVar9);
LAB_0018683d:
          bVar10 = true;
          goto LAB_0018683f;
        }
        break;
      case 4:
        uVar7 = (ulong)(uVar5 & 0x1fffffff);
        if ((this->m_buffer[uVar7 + 1] == '0') && (this->m_buffer[uVar7 + 2] != 'e')) {
          pcVar9 = "leading zero in integer";
          goto LAB_0018682c;
        }
        break;
      case 6:
        piVar1 = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1;
        local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1;
        if ((((ulong)pbVar2[*piVar1] & 0xe0000000) == 0x20000000) &&
           (iVar12 = *piVar1 + 1, local_6c != iVar12)) {
          do {
            uVar5 = SUB84(pbVar2[iVar12],4);
            iVar3 = iVar12 + (uVar5 & 0x1fffffff);
            iVar14 = iVar3 + (SUB84(pbVar2[iVar3],4) & 0x1fffffff);
            if (iVar14 == local_6c) {
              iVar6 = 5;
LAB_001867b2:
              bVar10 = false;
              iVar14 = iVar12;
            }
            else {
              uVar4 = SUB84(pbVar2[iVar14],4);
              uVar8 = SUB84(pbVar2[iVar12],0);
              uVar8 = (uVar5 >> 0x1d) + (uVar8 & 0x1fffffff) +
                      (uint)((uVar8 & 0xe0000000) != 0x60000000) * 8;
              iVar13 = ((SUB84(pbVar2[iVar3],0) & 0x1fffffff) - uVar8) + -2;
              uVar5 = SUB84(pbVar2[iVar14],0);
              uVar5 = (uVar4 >> 0x1d) + (uVar5 & 0x1fffffff) +
                      (uint)((uVar5 & 0xe0000000) != 0x60000000) * 8;
              iVar11 = ((*(uint *)(pbVar2 + (int)((uVar4 & 0x1fffffff) + iVar14)) & 0x1fffffff) -
                       uVar5) + -2;
              iVar3 = iVar13;
              if (iVar11 < iVar13) {
                iVar3 = iVar11;
              }
              iVar3 = memcmp(local_38->m_buffer + (ulong)uVar8 + 2,
                             local_38->m_buffer + (ulong)uVar5 + 2,(long)iVar3);
              pcVar9 = "unsorted dictionary key";
              if (0 < iVar3) {
LAB_00186799:
                snprintf(local_48,local_40,pcVar9);
                iVar6 = 1;
                goto LAB_001867b2;
              }
              bVar10 = true;
              iVar6 = 0;
              if (iVar3 == 0) {
                pcVar9 = "unsorted dictionary key";
                if ((iVar11 < iVar13) ||
                   (pcVar9 = "duplicate dictionary key", iVar6 = 0, iVar11 == iVar13))
                goto LAB_00186799;
              }
            }
            iVar12 = iVar14;
          } while (iVar6 == 0);
          this = local_38;
          if ((iVar6 != 5) && (!bVar10)) goto LAB_0018683d;
        }
      }
      local_6c = local_6c + 1;
    } while (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start !=
             local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
    bVar10 = false;
LAB_0018683f:
    if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return bVar10;
}

Assistant:

bool bdecode_node::has_soft_error(span<char> error) const
	{
		if (type() == none_t) return false;

		bdecode_token const* tokens = m_root_tokens;
		int token = m_token_idx;

		// we don't know what the original depth_limit was
		// so this has to go on the heap
		std::vector<int> stack;
		// make the initial allocation the default depth_limit
		stack.reserve(100);

		do
		{
			switch (tokens[token].type)
			{
			case bdecode_token::integer:
				if (m_buffer[tokens[token].offset + 1] == '0'
					&& m_buffer[tokens[token].offset + 2] != 'e')
				{
					std::snprintf(error.data(), std::size_t(error.size()), "leading zero in integer");
					return true;
				}
				break;
			case bdecode_token::string:
			case bdecode_token::long_string:
				if (m_buffer[tokens[token].offset] == '0'
					&& m_buffer[tokens[token].offset + 1] != ':')
				{
					std::snprintf(error.data(), std::size_t(error.size()), "leading zero in string length");
					return true;
				}
				break;
			case bdecode_token::dict:
			case bdecode_token::list:
				stack.push_back(token);
				break;
			case bdecode_token::end:
				auto const parent = stack.back();
				stack.pop_back();
				if (tokens[parent].type == bdecode_token::dict
					&& token != parent + 1)
				{
					// this is the end of a non-empty dict
					// check the sort order of the keys
					int k1 = parent + 1;
					for (;;)
					{
						// skip to the first key's value
						int const v1 = k1 + tokens[k1].next_item;
						// then to the next key
						int const k2 = v1 + tokens[v1].next_item;

						// check if k1 was the last key in the dict
						if (k2 == token)
							break;

						int const v2 = k2 + tokens[k2].next_item;

						int const k1_start = tokens[k1].offset + tokens[k1].start_offset();
						int const k1_len = tokens[v1].offset - k1_start;
						int const k2_start = tokens[k2].offset + tokens[k2].start_offset();
						int const k2_len = tokens[v2].offset - k2_start;

						int const min_len = std::min(k1_len, k2_len);

						int cmp = std::memcmp(m_buffer + k1_start, m_buffer + k2_start, std::size_t(min_len));
						if (cmp > 0 || (cmp == 0 && k1_len > k2_len))
						{
							std::snprintf(error.data(), std::size_t(error.size()), "unsorted dictionary key");
							return true;
						}
						else if (cmp == 0 && k1_len == k2_len)
						{
							std::snprintf(error.data(), std::size_t(error.size()), "duplicate dictionary key");
							return true;
						}

						k1 = k2;
					}
				}
				break;
			}

			++token;
		} while (!stack.empty());
		return false;
	}